

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O3

void __thiscall TypeOpIntDiv::TypeOpIntDiv(TypeOpIntDiv *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_INT_DIV,&local_38);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c0ba0;
  (this->super_TypeOpBinary).metaout = TYPE_UINT;
  (this->super_TypeOpBinary).metain = TYPE_UINT;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c04a0;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x10000;
  (this->super_TypeOpBinary).super_TypeOp.addlflags = 1;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_INT_DIV;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cba58;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpIntDiv::TypeOpIntDiv(TypeFactory *t)
  : TypeOpBinary(t,CPUI_INT_DIV,"/",TYPE_UINT,TYPE_UINT)
{
  opflags = PcodeOp::binary;
  addlflags = inherits_sign;
  behave = new OpBehaviorIntDiv();
}